

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.hpp
# Opt level: O3

archive_result_type<pstore::serialize::archive::database_writer>
pstore::serialize::
serializer<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_void>
::write<pstore::serialize::archive::database_writer>(database_writer *archive,value_type *value)

{
  archive_result_type<pstore::serialize::archive::database_writer_&> aVar1;
  address local_20;
  
  aVar1 = string_helper::write<pstore::serialize::archive::database_writer&,std::__cxx11::string>
                    (archive,&value->first);
  local_20.a_ = (value->second).addr.a_.a_;
  serialize::archive::writer_base<pstore::serialize::archive::details::database_writer_policy>::
  put<unsigned_long>(&archive->
                      super_writer_base<pstore::serialize::archive::details::database_writer_policy>
                     ,&local_20.a_);
  serialize::archive::writer_base<pstore::serialize::archive::details::database_writer_policy>::
  put<unsigned_long>(&archive->
                      super_writer_base<pstore::serialize::archive::details::database_writer_policy>
                     ,&(value->second).size);
  return (archive_result_type<pstore::serialize::archive::database_writer>)aVar1.a_;
}

Assistant:

static auto write (Archive && archive, value_type const & value)
                -> archive_result_type<Archive> {

                auto const result = serialize::write (archive, value.first);
                serialize::write (archive, value.second);
                return result;
            }